

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thetaneuron.cxx
# Opt level: O1

void __thiscall ThetaNeuron::ThetaNeuron(ThetaNeuron *this,Time *time,string *name,string *type)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  Time *pTVar3;
  StochasticProcess *this_00;
  StochasticVariable *integrator;
  string local_f8;
  string local_d8;
  DifferentialEquation *local_b8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  pcVar2 = (name->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,pcVar2 + name->_M_string_length);
  pcVar2 = (type->_M_dataplus)._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar2,pcVar2 + type->_M_string_length);
  SpikingNeuron::SpikingNeuron(&this->super_SpikingNeuron,time,&local_50,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  (this->super_SpikingNeuron).super_Neuron._vptr_Neuron =
       (_func_int **)&PTR___cxa_pure_virtual_0015f240;
  (this->super_SpikingNeuron).super_StochasticEventGenerator.super_StochasticVariable.
  super_StochasticProcess.super_Parametric._vptr_Parametric =
       (_func_int **)&PTR__ThetaNeuron_0015f278;
  (this->super_SpikingNeuron).super_StochasticEventGenerator.super_StochasticVariable.
  super_StochasticProcess.super_TimeDependent._vptr_TimeDependent =
       (_func_int **)&PTR__ThetaNeuron_0015f310;
  (this->super_SpikingNeuron).super_StochasticEventGenerator.super_StochasticVariable.
  super_StochasticProcess.super_Physical._vptr_Physical = (_func_int **)&PTR__ThetaNeuron_0015f358;
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  paVar1 = &local_d8.field_2;
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"Differential Equation","");
  local_b8 = &this->thetaMembrane;
  DifferentialEquation::DifferentialEquation(local_b8,time,3.1415926535,0.0,&local_f8,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_SpikingNeuron).super_StochasticEventGenerator.
                     super_StochasticVariable.super_StochasticProcess.super_Physical.
                     physicalDescription,0,
             (char *)(this->super_SpikingNeuron).super_StochasticEventGenerator.
                     super_StochasticVariable.super_StochasticProcess.super_Physical.
                     physicalDescription._M_string_length,0x14d87f);
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_SpikingNeuron).super_StochasticEventGenerator.
                     super_StochasticVariable.super_StochasticProcess.stochDescription,0,
             (char *)(this->super_SpikingNeuron).super_StochasticEventGenerator.
                     super_StochasticVariable.super_StochasticProcess.stochDescription.
                     _M_string_length,0x14e640);
  this_00 = (StochasticProcess *)operator_new(0x148);
  pTVar3 = (this->super_SpikingNeuron).super_StochasticEventGenerator.super_StochasticVariable.
           super_StochasticProcess.super_TimeDependent.xTime;
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"Theta Membrane","");
  StochasticProcess::StochasticProcess(this_00,pTVar3,&local_f8,&local_d8);
  (this_00->super_Parametric)._vptr_Parametric = (_func_int **)&PTR__StochasticProcess_0015f3d8;
  (this_00->super_TimeDependent)._vptr_TimeDependent = (_func_int **)&PTR__ThetaMembrane_0015f488;
  (this_00->super_Physical)._vptr_Physical = (_func_int **)&PTR__ThetaMembrane_0015f4d0;
  integrator = (StochasticVariable *)operator_new(0x148);
  pTVar3 = (this->super_SpikingNeuron).super_StochasticEventGenerator.super_StochasticVariable.
           super_StochasticProcess.super_TimeDependent.xTime;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"t","");
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Time Process","");
  TimeProcess::TimeProcess((TimeProcess *)integrator,pTVar3,&local_b0,&local_90);
  DifferentialEquation::addTerm(local_b8,(StochasticFunction *)this_00,integrator);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

ThetaNeuron::ThetaNeuron(Time *time, const string& name, const string& type)
	: SpikingNeuron(time, name, type), thetaMembrane(time, 3.1415926535, 0.0)
{
	physicalDescription = "voltage";
	stochDescription = "theta neuron";
	thetaMembrane.addTerm( new ThetaMembrane(xTime), new TimeProcess(xTime) );
}